

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int64_t av1_rd_pick_intra_sbuv_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,TX_SIZE max_tx_size)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar3;
  int64_t iVar4;
  byte tx_size;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  _Bool *p_Var10;
  buf_2d *ref;
  ulong uVar11;
  long lVar12;
  char cVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  long lVar19;
  char cVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int cfl_linear_idx;
  RD_STATS *pRVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  int64_t best_rd;
  int local_c94;
  RD_STATS tokenonly_rd_stats;
  long local_c20;
  IntraModeSearchState intra_search_state;
  MB_MODE_INFO best_mbmi;
  int this_rate;
  int iStack_a84;
  long alStack_a80 [3];
  byte bStack_a68;
  undefined1 auStack_a67 [3];
  undefined4 auStack_a64 [323];
  RD_STATS local_558 [33];
  
  mbmi = *(x->e_mbd).mi;
  memcpy(&best_mbmi,mbmi,0xb0);
  best_rd = 0x7fffffffffffffff;
  mbmi->uv_mode = '\0';
  (mbmi->palette_mode_info).palette_size[1] = '\0';
  if ((x->e_mbd).is_chroma_ref == false) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = '\x01';
    best_rd = 0x7fffffffffffffff;
  }
  else {
    if (((cpi->common).seq_params)->monochrome == '\0') {
      pMVar3 = *(x->e_mbd).mi;
      uVar9 = (ulong)pMVar3->bsize;
      if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
        bVar28 = (0x2f0bffUL >> (uVar9 & 0x3f) & 1) != 0;
        if ((0x1f07ffUL >> (uVar9 & 0x3f) & 1) == 0) {
          bVar28 = false;
        }
      }
      else {
        bVar28 = av1_ss_size_lookup[uVar9][(x->e_mbd).plane[1].subsampling_x]
                 [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4;
      }
    }
    else {
      bVar28 = false;
    }
    (x->e_mbd).cfl.store_y = (uint)bVar28;
    if (bVar28 != false) {
      av1_encode_intra_block_plane
                (cpi,x,mbmi->bsize,0,'\x01',cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7])
      ;
      (x->e_mbd).cfl.store_y = 0;
    }
    intra_search_state.directional_mode_skip_mask[8] = '\0';
    intra_search_state.directional_mode_skip_mask[9] = '\0';
    intra_search_state.directional_mode_skip_mask[10] = '\0';
    intra_search_state.directional_mode_skip_mask[0xb] = '\0';
    intra_search_state.directional_mode_skip_mask[0xc] = '\0';
    intra_search_state._21_3_ = 0;
    intra_search_state.pmi_uv.palette_colors[0xf] = 0;
    intra_search_state.pmi_uv.palette_colors[0x10] = 0;
    intra_search_state.pmi_uv.palette_colors[0x11] = 0;
    intra_search_state.pmi_uv.palette_colors[0x12] = 0;
    intra_search_state.pmi_uv.palette_colors[0x13] = 0;
    intra_search_state.pmi_uv.palette_colors[0x14] = 0;
    intra_search_state.pmi_uv.palette_colors[0x15] = 0;
    intra_search_state.pmi_uv.palette_colors[0x16] = 0;
    intra_search_state.pmi_uv.palette_colors[7] = 0;
    intra_search_state.pmi_uv.palette_colors[8] = 0;
    intra_search_state.pmi_uv.palette_colors[9] = 0;
    intra_search_state.pmi_uv.palette_colors[10] = 0;
    intra_search_state.pmi_uv.palette_colors[0xb] = 0;
    intra_search_state.pmi_uv.palette_colors[0xc] = 0;
    intra_search_state.pmi_uv.palette_colors[0xd] = 0;
    intra_search_state.pmi_uv.palette_colors[0xe] = 0;
    intra_search_state.skip_uvs = '\0';
    intra_search_state.mode_uv = '\0';
    intra_search_state.pmi_uv.palette_colors[0] = 0;
    intra_search_state.pmi_uv.palette_colors[1] = 0;
    intra_search_state.pmi_uv.palette_colors[2] = 0;
    intra_search_state.pmi_uv.palette_colors[3] = 0;
    intra_search_state.pmi_uv.palette_colors[4] = 0;
    intra_search_state.pmi_uv.palette_colors[5] = 0;
    intra_search_state.pmi_uv.palette_colors[6] = 0;
    intra_search_state.rate_uv_tokenonly = 0;
    intra_search_state._36_4_ = 0;
    intra_search_state.dist_uvs = 0;
    intra_search_state.best_intra_mode = '\0';
    intra_search_state._1_3_ = 0;
    intra_search_state.skip_intra_modes = 0;
    intra_search_state.directional_mode_skip_mask[0] = '\0';
    intra_search_state.directional_mode_skip_mask[1] = '\0';
    intra_search_state.directional_mode_skip_mask[2] = '\0';
    intra_search_state.directional_mode_skip_mask[3] = '\0';
    intra_search_state.directional_mode_skip_mask[4] = '\0';
    intra_search_state.directional_mode_skip_mask[5] = '\0';
    intra_search_state.directional_mode_skip_mask[6] = '\0';
    intra_search_state.directional_mode_skip_mask[7] = '\0';
    intra_search_state.pmi_uv.palette_colors[0x17] = 0;
    intra_search_state.pmi_uv.palette_size[0] = '\0';
    intra_search_state.pmi_uv.palette_size[1] = '\0';
    intra_search_state.uv_angle_delta = '\0';
    intra_search_state._101_3_ = 0;
    intra_search_state.dir_mode_skip_mask_ready = 0;
    intra_search_state.rate_uv_intra = 0x7fffffff;
    pMVar3 = *(x->e_mbd).mi;
    uVar9 = (ulong)pMVar3->bsize;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
      uVar15 = (uint)((0x2f0bffUL >> (uVar9 & 0x3f) & 1) != 0);
      if ((0x1f07ffUL >> (uVar9 & 0x3f) & 1) == 0) {
        uVar15 = 0;
      }
    }
    else {
      uVar15 = (uint)(av1_ss_size_lookup[uVar9][(x->e_mbd).plane[1].subsampling_x]
                      [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4);
    }
    uVar9 = (ulong)uVar15;
    uVar26 = 0;
    do {
      iVar4 = best_rd;
      bVar1 = ""[uVar26];
      if ((((((long)x->rdmult * (long)(x->mode_costs).intra_uv_mode_cost[uVar9][mbmi->mode][bVar1] +
              0x100 >> 9 <= best_rd) &&
            ((bVar17 = get_uv_mode_uv2y[bVar1] - 9, bVar17 < 0xfa ||
             ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra == true)))) &&
           ((bVar17 < 0xf8 || ((cpi->oxcf).intra_mode_cfg.enable_directional_intra == true)))) &&
          ((((uint)(cpi->sf).intra_sf.intra_uv_mode_mask[""[max_tx_size]] >> (bVar1 & 0x1f) & 1) !=
            0 && ((((((uint)uVar26 & 0xb) == 1 ||
                    ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra != false)) ||
                   ((0xf2UL >> (uVar26 & 0x3f) & 1) == 0)) &&
                  ((uVar26 != 5 || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false))))))))
         && (((cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner == 0 ||
             ((1 << (bVar1 & 0x1f) & (uint)av1_derived_chroma_intra_mode_used_flag[mbmi->mode]) != 0
             )))) {
        mbmi->uv_mode = bVar1;
        mbmi->angle_delta[1] = '\0';
        if (uVar26 == 1) {
          if ((uVar9 != 0) && ((cpi->oxcf).intra_mode_cfg.enable_cfl_intra == true)) {
            pMVar3 = *(x->e_mbd).mi;
            if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
              bVar17 = ""[av1_ss_size_lookup[pMVar3->bsize][(x->e_mbd).plane[1].subsampling_x]
                          [(x->e_mbd).plane[1].subsampling_y]];
              if (bVar17 < 0x11) {
                tx_size = 3;
                if ((1 < bVar17 - 0xb) && (tx_size = 3, bVar17 != 4)) {
LAB_0024891b:
                  tx_size = bVar17;
                }
              }
              else if (bVar17 == 0x11) {
                tx_size = 9;
              }
              else {
                if (bVar17 != 0x12) goto LAB_0024891b;
                tx_size = 10;
              }
            }
            else {
              tx_size = 0;
            }
            iVar7 = (cpi->sf).intra_sf.cfl_search_range;
            tokenonly_rd_stats.rate = 0x7fffffff;
            tokenonly_rd_stats.zero_rate = 0;
            tokenonly_rd_stats.dist = 0x7fffffffffffffff;
            tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
            tokenonly_rd_stats.sse = 0x7fffffffffffffff;
            tokenonly_rd_stats.skip_txfm = '\0';
            (x->e_mbd).cfl.use_dc_pred_cache = true;
            iVar5 = cfl_pick_plane_parameter(cpi,x,1,tx_size,iVar7);
            iVar6 = cfl_pick_plane_parameter(cpi,x,2,tx_size,iVar7);
            if (iVar7 == 1) {
              if (iVar6 != 0x10 || iVar5 != 0x10) {
                iVar18 = iVar5 + -0x10;
                if (iVar18 == 0) {
                  lVar14 = -1;
                  lVar16 = 0;
                }
                else {
                  iVar22 = -iVar18;
                  if (0 < iVar18) {
                    iVar22 = iVar18;
                  }
                  lVar16 = (long)(iVar22 + -1);
                  lVar14 = (ulong)(0x10 < iVar5) * 3 + 2;
                }
                lVar19 = 0;
                iVar18 = iVar6 + -0x10;
                if (iVar18 == 0) {
                  lVar21 = 0;
                }
                else {
                  iVar22 = -iVar18;
                  if (0 < iVar18) {
                    iVar22 = iVar18;
                  }
                  lVar19 = (ulong)(0x10 < iVar6) + 1;
                  lVar21 = (long)(iVar22 + -1);
                }
                pMVar3 = *(x->e_mbd).mi;
                BVar2 = pMVar3->bsize;
                if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
                  uVar11 = (ulong)((uint)(0x1f07ffL >> (BVar2 & 0x3f)) &
                                   (uint)(0x2f0bffL >> (BVar2 & 0x3f)) & 1);
                }
                else {
                  uVar11 = (ulong)(av1_ss_size_lookup[BVar2][(x->e_mbd).plane[1].subsampling_x]
                                   [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4);
                }
                if ((long)x->rdmult *
                    ((long)(x->mode_costs).intra_uv_mode_cost[uVar11][pMVar3->mode][0xd] +
                    (long)(x->mode_costs).cfl_cost[lVar19 + lVar14][1][lVar21] +
                    (long)(x->mode_costs).cfl_cost[lVar19 + lVar14][0][lVar16]) + 0x100 >> 9 <=
                    iVar4) goto LAB_00248583;
              }
              mbmi->cfl_alpha_signs = '\0';
              mbmi->cfl_alpha_idx = '\0';
              (x->e_mbd).cfl.use_dc_pred_cache = false;
              (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
              p_Var10 = (x->e_mbd).cfl.dc_pred_is_cached + 1;
            }
            else {
LAB_00248583:
              cfl_pick_plane_rd(cpi,x,1,tx_size,iVar7,(RD_STATS *)&this_rate,iVar5);
              cfl_pick_plane_rd(cpi,x,2,tx_size,iVar7,local_558,iVar6);
              (x->e_mbd).cfl.use_dc_pred_cache = false;
              (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
              (x->e_mbd).cfl.dc_pred_is_cached[1] = false;
              local_c20 = tokenonly_rd_stats.rdcost;
              uVar11 = 0;
              do {
                iVar7 = (&this_rate)[uVar11 * 10];
                if ((long)iVar7 != 0x7fffffff) {
                  if (uVar11 - 0x10 == 0) {
                    cVar20 = '\0';
                    iVar5 = 0;
                  }
                  else {
                    cVar20 = '\x02' - (uVar11 < 0x11);
                    iVar6 = (int)(uVar11 - 0x10);
                    iVar5 = -iVar6;
                    if (0 < iVar6) {
                      iVar5 = iVar6;
                    }
                    iVar5 = iVar5 + -1;
                  }
                  lVar14 = uVar11 * 0x28;
                  lVar16 = -0x10;
                  pRVar24 = local_558;
                  do {
                    lVar19 = 0x7fffffffffffffff;
                    if ((long)pRVar24->rate != 0x7fffffff) {
                      if (lVar16 == 0) {
                        cVar13 = '\0';
                        iVar6 = 0;
                      }
                      else {
                        cVar13 = '\x02' - (lVar16 + 0x10U < 0x11);
                        iVar18 = (int)lVar16;
                        iVar6 = -iVar18;
                        if (0 < iVar18) {
                          iVar6 = iVar18;
                        }
                        iVar6 = iVar6 + -1;
                      }
                      if (cVar13 != '\0' || cVar20 != '\0') {
                        iVar18 = (&iStack_a84)[uVar11 * 10];
                        lVar21 = (long)pRVar24->rate + (long)iVar7;
                        if (0x7ffffffe < lVar21) {
                          lVar21 = 0x7fffffff;
                        }
                        uVar15 = (uint)lVar21;
                        if (iVar18 == 0) {
                          iVar18 = pRVar24->zero_rate;
                        }
                        lVar21 = alStack_a80[uVar11 * 5 + 2];
                        if (lVar21 != 0x7fffffffffffffff) {
                          lVar12 = 0;
                          if (pRVar24->sse != 0x7fffffffffffffff) {
                            lVar12 = pRVar24->sse;
                          }
                          lVar21 = lVar21 + lVar12;
                        }
                        iVar22 = (byte)(cVar13 + cVar20 * '\x03') - 1;
                        if (uVar15 != 0x7fffffff) {
                          uVar15 = uVar15 + (x->mode_costs).cfl_cost[iVar22][0][iVar5] +
                                   (x->mode_costs).cfl_cost[iVar22][1][iVar6];
                        }
                        bVar17 = 0;
                        if (uVar15 == 0x7fffffff) {
                          lVar12 = 0x7fffffffffffffff;
                          lVar25 = 0x7fffffffffffffff;
                          uVar8 = 0x7fffffff;
                          iVar23 = 0;
                        }
                        else {
                          lVar19 = 0x7fffffffffffffff;
                          lVar27 = alStack_a80[uVar11 * 5] + pRVar24->dist;
                          uVar8 = 0x7fffffff;
                          if (lVar27 == 0x7fffffffffffffff) {
                            lVar12 = lVar19;
                            lVar25 = lVar19;
                            iVar23 = 0;
                          }
                          else {
                            lVar19 = 0x7fffffffffffffff;
                            lVar12 = 0x7fffffffffffffff;
                            lVar25 = 0x7fffffffffffffff;
                            local_c94 = iVar18;
                            iVar23 = 0;
                            if (alStack_a80[uVar11 * 5 + 1] != 0x7fffffffffffffff) {
                              bVar17 = auStack_a67[lVar14 + -1] & pRVar24->skip_txfm;
                              lVar12 = lVar21;
                              lVar25 = lVar27;
                              uVar8 = uVar15;
                              iVar23 = iVar18;
                              if ((int)uVar15 < 0) {
                                lVar19 = lVar27 * 0x80 -
                                         ((long)((long)x->rdmult * (ulong)-uVar15 + 0x100) >> 9);
                              }
                              else {
                                lVar19 = lVar27 * 0x80 +
                                         ((long)((long)x->rdmult * (ulong)uVar15 + 0x100) >> 9);
                              }
                            }
                          }
                        }
                        if (lVar19 < local_c20) {
                          tokenonly_rd_stats.zero_rate = iVar23;
                          tokenonly_rd_stats.rate = uVar8;
                          tokenonly_rd_stats._33_4_ = *(undefined4 *)(auStack_a67 + lVar14);
                          tokenonly_rd_stats._37_3_ =
                               SUB43((uint)*(undefined4 *)(auStack_a67 + lVar14 + 3) >> 8,0);
                          mbmi->cfl_alpha_idx = (char)iVar6 + (char)(iVar5 << 4);
                          mbmi->cfl_alpha_signs = (int8_t)iVar22;
                          tokenonly_rd_stats.dist = lVar25;
                          tokenonly_rd_stats.rdcost = lVar19;
                          tokenonly_rd_stats.sse = lVar12;
                          tokenonly_rd_stats.skip_txfm = bVar17;
                          local_c20 = lVar19;
                        }
                      }
                    }
                    lVar16 = lVar16 + 1;
                    pRVar24 = pRVar24 + 1;
                  } while (lVar16 != 0x11);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != 0x21);
              if (tokenonly_rd_stats.rdcost < iVar4) goto LAB_00248316;
              tokenonly_rd_stats.rate = 0x7fffffff;
              tokenonly_rd_stats.zero_rate = 0;
              tokenonly_rd_stats.dist = 0x7fffffffffffffff;
              tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
              tokenonly_rd_stats.sse = 0x7fffffffffffffff;
              tokenonly_rd_stats.skip_txfm = '\0';
              mbmi->cfl_alpha_idx = '\0';
              p_Var10 = (_Bool *)&mbmi->cfl_alpha_signs;
            }
            *p_Var10 = false;
          }
        }
        else {
          if (((bVar17 < 0xf8) || (mbmi->bsize < BLOCK_8X8)) ||
             ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != true)) {
            if ((uVar26 == 4) && ((cpi->sf).intra_sf.prune_smooth_intra_mode_for_chroma == true)) {
              bVar28 = ((cpi->common).seq_params)->monochrome != '\0';
              if ((!bVar28) &&
                 (uVar15 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&x->plane[1].src,bsize,1),
                 uVar15 < 0x14)) {
                uVar11 = 1;
                ref = &x->plane[2].src;
                do {
                  bVar28 = 1 < uVar11 || ((cpi->common).seq_params)->monochrome != '\0';
                  if (bVar28) break;
                  uVar11 = uVar11 + 1;
                  uVar15 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,ref,bsize,(int)uVar11);
                  ref = (buf_2d *)&ref[4].buf0;
                } while (uVar15 < 0x14);
              }
              if (bVar28) goto LAB_00247f13;
            }
            iVar7 = av1_txfm_uvrd(cpi,x,&tokenonly_rd_stats,bsize,best_rd);
          }
          else {
            lVar14 = (long)(cpi->sf).intra_sf.chroma_intra_pruning_with_hog;
            if ((lVar14 != 0) && (intra_search_state.dir_mode_skip_mask_ready == 0)) {
              prune_intra_mode_with_hog
                        (x,bsize,((cpi->common).seq_params)->sb_size,
                         *(float *)("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11" +
                                   lVar14 * 4 +
                                   (ulong)(((cpi->common).current_frame.frame_type & 0xfd) == 0) *
                                   0x10 + 9),intra_search_state.directional_mode_skip_mask,1);
              intra_search_state.dir_mode_skip_mask_ready = 1;
            }
            if (intra_search_state.directional_mode_skip_mask[bVar1] != '\0') goto LAB_00247f13;
            iVar7 = rd_pick_intra_angle_sbuv
                              (cpi,x,bsize,
                               (x->mode_costs).intra_uv_mode_cost[uVar9][mbmi->mode][bVar1],best_rd,
                               &this_rate,&tokenonly_rd_stats);
          }
          if (iVar7 != 0) {
LAB_00248316:
            lVar14 = (long)tokenonly_rd_stats.rate;
            iVar7 = intra_mode_info_cost_uv
                              (cpi,x,mbmi,bsize,
                               (x->mode_costs).intra_uv_mode_cost[uVar9][mbmi->mode][bVar1]);
            iVar4 = tokenonly_rd_stats.dist;
            iVar5 = (int)(iVar7 + lVar14);
            this_rate = iVar5;
            lVar14 = tokenonly_rd_stats.dist * 0x80 +
                     ((long)x->rdmult * (iVar7 + lVar14) + 0x100 >> 9);
            if (lVar14 < best_rd) {
              memcpy(&best_mbmi,mbmi,0xb0);
              *rate = iVar5;
              *rate_tokenonly = tokenonly_rd_stats.rate;
              *distortion = iVar4;
              *skippable = tokenonly_rd_stats.skip_txfm;
              best_rd = lVar14;
            }
          }
        }
      }
LAB_00247f13:
      uVar26 = uVar26 + 1;
    } while (uVar26 != 0xe);
    if ((((cpi->oxcf).tool_cfg.enable_palette != false) &&
        ((cpi->common).features.allow_screen_content_tools != false)) &&
       ((0xf < mbmi->bsize || ((0xe007U >> (mbmi->bsize & 0x1f) & 1) == 0)))) {
      av1_rd_pick_palette_intra_sbuv
                (cpi,x,(x->mode_costs).intra_uv_mode_cost[uVar9][mbmi->mode][0],
                 x->palette_buffer->best_palette_color_map,&best_mbmi,&best_rd,rate,rate_tokenonly,
                 distortion,skippable);
    }
    memcpy(mbmi,&best_mbmi,0xb0);
  }
  return best_rd;
}

Assistant:

int64_t av1_rd_pick_intra_sbuv_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int *rate, int *rate_tokenonly,
                                    int64_t *distortion, uint8_t *skippable,
                                    BLOCK_SIZE bsize, TX_SIZE max_tx_size) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  MB_MODE_INFO best_mbmi = *mbmi;
  int64_t best_rd = INT64_MAX, this_rd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;

  init_sbuv_mode(mbmi);

  // Return if the current block does not correspond to a chroma block.
  if (!xd->is_chroma_ref) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = 1;
    return INT64_MAX;
  }

  // Only store reconstructed luma when there's chroma RDO. When there's no
  // chroma RDO, the reconstructed luma will be stored in encode_superblock().
  xd->cfl.store_y = store_cfl_required_rdo(cm, x);
  if (xd->cfl.store_y) {
    // Restore reconstructed luma values.
    // TODO(chiyotsai@google.com): right now we are re-computing the txfm in
    // this function everytime we search through uv modes. There is some
    // potential speed up here if we cache the result to avoid redundant
    // computation.
    av1_encode_intra_block_plane(cpi, x, mbmi->bsize, AOM_PLANE_Y,
                                 DRY_RUN_NORMAL,
                                 cpi->optimize_seg_arr[mbmi->segment_id]);
    xd->cfl.store_y = 0;
  }
  IntraModeSearchState intra_search_state;
  init_intra_mode_search_state(&intra_search_state);
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);

  // Search through all non-palette modes.
  for (int mode_idx = 0; mode_idx < UV_INTRA_MODES; ++mode_idx) {
    int this_rate;
    RD_STATS tokenonly_rd_stats;
    UV_PREDICTION_MODE uv_mode = uv_rd_search_mode_order[mode_idx];

    // Skip the current mode evaluation if the RD cost derived using the mode
    // signaling rate exceeds the best_rd so far.
    const int mode_rate =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    if (RDCOST(x->rdmult, mode_rate, 0) > best_rd) continue;

    PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    const int is_diagonal_mode = av1_is_diagonal_mode(intra_mode);
    const int is_directional_mode = av1_is_directional_mode(intra_mode);

    if (is_diagonal_mode && !cpi->oxcf.intra_mode_cfg.enable_diagonal_intra)
      continue;
    if (is_directional_mode &&
        !cpi->oxcf.intra_mode_cfg.enable_directional_intra)
      continue;

    if (!(cpi->sf.intra_sf.intra_uv_mode_mask[txsize_sqr_up_map[max_tx_size]] &
          (1 << uv_mode)))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && uv_mode >= UV_SMOOTH_PRED &&
        uv_mode <= UV_SMOOTH_H_PRED)
      continue;

    if (!intra_mode_cfg->enable_paeth_intra && uv_mode == UV_PAETH_PRED)
      continue;

    assert(mbmi->mode < INTRA_MODES);
    if (cpi->sf.intra_sf.prune_chroma_modes_using_luma_winner &&
        !(av1_derived_chroma_intra_mode_used_flag[mbmi->mode] & (1 << uv_mode)))
      continue;

    mbmi->uv_mode = uv_mode;

    // Init variables for cfl and angle delta
    const SPEED_FEATURES *sf = &cpi->sf;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    if (uv_mode == UV_CFL_PRED) {
      if (!cfl_allowed || !intra_mode_cfg->enable_cfl_intra) continue;
      assert(!is_directional_mode);
      const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      if (!cfl_rd_pick_alpha(x, cpi, uv_tx_size, best_rd,
                             sf->intra_sf.cfl_search_range, &tokenonly_rd_stats,
                             &mbmi->cfl_alpha_idx, &mbmi->cfl_alpha_signs)) {
        continue;
      }
    } else if (is_directional_mode && av1_use_angle_delta(mbmi->bsize) &&
               intra_mode_cfg->enable_angle_delta) {
      if (sf->intra_sf.chroma_intra_pruning_with_hog &&
          !intra_search_state.dir_mode_skip_mask_ready) {
        static const float thresh[2][4] = {
          { -1.2f, 0.0f, 0.0f, 1.2f },    // Interframe
          { -1.2f, -1.2f, -0.6f, 0.4f },  // Intraframe
        };
        const int is_chroma = 1;
        const int is_intra_frame = frame_is_intra_only(cm);
        prune_intra_mode_with_hog(
            x, bsize, cm->seq_params->sb_size,
            thresh[is_intra_frame]
                  [sf->intra_sf.chroma_intra_pruning_with_hog - 1],
            intra_search_state.directional_mode_skip_mask, is_chroma);
        intra_search_state.dir_mode_skip_mask_ready = 1;
      }
      if (intra_search_state.directional_mode_skip_mask[uv_mode]) {
        continue;
      }

      // Search through angle delta
      const int rate_overhead =
          mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
      if (!rd_pick_intra_angle_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                    &this_rate, &tokenonly_rd_stats))
        continue;
    } else {
      if (uv_mode == UV_SMOOTH_PRED &&
          should_prune_chroma_smooth_pred_based_on_source_variance(cpi, x,
                                                                   bsize))
        continue;

      // Predict directly if we don't need to search for angle delta.
      if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd)) {
        continue;
      }
    }
    const int mode_cost =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_uv(cpi, x, mbmi, bsize, mode_cost);
    this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);

    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      *rate = this_rate;
      *rate_tokenonly = tokenonly_rd_stats.rate;
      *distortion = tokenonly_rd_stats.dist;
      *skippable = tokenonly_rd_stats.skip_txfm;
    }
  }

  // Search palette mode
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  if (try_palette) {
    uint8_t *best_palette_color_map = x->palette_buffer->best_palette_color_map;
    av1_rd_pick_palette_intra_sbuv(
        cpi, x,
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][UV_DC_PRED],
        best_palette_color_map, &best_mbmi, &best_rd, rate, rate_tokenonly,
        distortion, skippable);
  }

  *mbmi = best_mbmi;
  // Make sure we actually chose a mode
  assert(best_rd < INT64_MAX);
  return best_rd;
}